

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-run.c
# Opt level: O0

ztresult_t
zt_run_statements(ztast_statement_t *statements,ztstruct_t *meta,ztregion_t *regions,int nregions,
                 ztloader_t **loaders,int nloaders,void *structure,char *errbuf)

{
  ztresult_t zVar1;
  undefined8 *in_RDI;
  undefined8 in_stack_00000008;
  char *in_stack_00000010;
  ztast_statement_t *statement;
  ztresult_t rc;
  int in_stack_000002a4;
  ztloader_t **in_stack_000002a8;
  int in_stack_000002b4;
  ztregion_t *in_stack_000002b8;
  ztstruct_t *in_stack_000002c0;
  ztast_assignment_t *in_stack_000002c8;
  void *in_stack_000002e0;
  char *in_stack_000002e8;
  undefined8 in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  undefined8 *local_40;
  
  local_40 = in_RDI;
  while( true ) {
    if (local_40 == (undefined8 *)0x0) {
      return 0;
    }
    if (*(int *)(local_40 + 1) != 0) break;
    in_stack_ffffffffffffffa8 = in_stack_00000008;
    in_stack_ffffffffffffffb0 = in_stack_00000010;
    zVar1 = zt_do_assignment(in_stack_000002c8,in_stack_000002c0,in_stack_000002b8,in_stack_000002b4
                             ,in_stack_000002a8,in_stack_000002a4,in_stack_000002e0,
                             in_stack_000002e8);
    if (zVar1 != 0) {
      return zVar1;
    }
    local_40 = (undefined8 *)*local_40;
  }
  zVar1 = zt_mksyntax(in_stack_ffffffffffffffb0,
                      (ztsyntaxerr_t)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
  return zVar1;
}

Assistant:

static ztresult_t zt_run_statements(const ztast_statement_t *statements,
                                    const ztstruct_t        *meta,
                                    const ztregion_t        *regions,
                                    int                      nregions,
                                    ztloader_t             **loaders,
                                    int                      nloaders,
                                    void                    *structure,
                                    char                    *errbuf)
{
  ztresult_t               rc;
  const ztast_statement_t *statement;

  for (statement = statements; statement; statement = statement->next)
  {
    switch (statement->type)
    {
    case ZTSTMT_ASSIGNMENT:
      rc = zt_do_assignment(statement->u.assignment,
                            meta,
                            regions,
                            nregions,
                            loaders,
                            nloaders,
                            structure,
                            errbuf);
      if (rc)
        return rc;
      break;

    default:
      return zt_mksyntax(errbuf, ztsyntx_UNSUPPORTED);
    }
  }

  return ztresult_OK;
}